

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O0

void __thiscall SPTest_OrderConsByStage_Test::TestBody(SPTest_OrderConsByStage_Test *this)

{
  StringRef name;
  bool bVar1;
  SuffixBase this_00;
  BasicProblem<mp::BasicProblemParams<int>_> *message;
  int iVar2;
  AssertHelper *this_01;
  int *expected;
  MutAlgebraicCon MVar3;
  AlgebraicCon AVar4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  SPAdapter sp;
  LinearConHandler expr;
  IntSuffixHandler stage;
  TestProblem p;
  NLHeader header;
  TestProblem *in_stack_fffffffffffff748;
  int in_stack_fffffffffffff750;
  int in_stack_fffffffffffff754;
  undefined4 uVar5;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffff758;
  undefined4 in_stack_fffffffffffff760;
  undefined4 in_stack_fffffffffffff764;
  undefined4 in_stack_fffffffffffff768;
  int in_stack_fffffffffffff76c;
  int line;
  TestProblem *in_stack_fffffffffffff770;
  undefined4 in_stack_fffffffffffff77c;
  Type type;
  double in_stack_fffffffffffff800;
  undefined4 in_stack_fffffffffffff808;
  undefined4 in_stack_fffffffffffff80c;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffff810;
  AssertionResult local_7e0 [2];
  BasicProblem<mp::BasicProblemParams<int>_> *local_7c0;
  int local_7b8;
  BasicProblem<mp::BasicProblemParams<int>_> *local_7b0;
  int local_7a8;
  AssertHelper *local_7a0;
  undefined4 local_794;
  AssertionResult local_790 [3];
  ColProblem *in_stack_fffffffffffff8a8;
  SPAdapter *in_stack_fffffffffffff8b0;
  
  MakeHeader(in_stack_fffffffffffff754,in_stack_fffffffffffff750);
  TestProblem::TestProblem
            (in_stack_fffffffffffff770,
             (NLHeader *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
             (char *)in_stack_fffffffffffff748);
  name.data_._4_4_ = in_stack_fffffffffffff764;
  name.data_._0_4_ = in_stack_fffffffffffff760;
  name.size_._0_4_ = in_stack_fffffffffffff768;
  name.size_._4_4_ = in_stack_fffffffffffff76c;
  this_00.impl_ =
       (Impl *)mp::BasicProblem<mp::BasicProblemParams<int>_>::AddIntSuffix
                         (in_stack_fffffffffffff758,name,in_stack_fffffffffffff754,
                          in_stack_fffffffffffff750);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::SuffixHandler<int>::SetValue
            ((SuffixHandler<int> *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
             (int)((ulong)in_stack_fffffffffffff748 >> 0x20),(int)in_stack_fffffffffffff748);
  MVar3 = mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
                    (in_stack_fffffffffffff810,
                     (double)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                     in_stack_fffffffffffff800);
  message = MVar3.
            super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
            .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
            (in_stack_fffffffffffff810,
             (double)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
             in_stack_fffffffffffff800);
  TestProblem::OnColumnSizes(in_stack_fffffffffffff748);
  mp::ColProblemBuilder::ColumnSizeHandler::Add
            ((ColumnSizeHandler *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750),
             (int)((ulong)in_stack_fffffffffffff748 >> 0x20));
  TestProblem::OnLinearConExpr
            ((TestProblem *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (int)((ulong)in_stack_fffffffffffff758 >> 0x20));
  mp::ColProblemBuilder::LinearConHandler::AddTerm
            ((LinearConHandler *)in_stack_fffffffffffff770,in_stack_fffffffffffff76c,
             (double)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
  mp::SPAdapter::SPAdapter(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
  local_794 = 0xb;
  AVar4 = mp::SPAdapter::con((SPAdapter *)
                             CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
                             (int)((ulong)in_stack_fffffffffffff758 >> 0x20));
  local_7c0 = AVar4.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              problem_;
  local_7b8 = AVar4.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
              index_;
  local_7b0 = local_7c0;
  local_7a8 = local_7b8;
  this_01 = (AssertHelper *)
            mp::BasicProblem<mp::BasicProblemParams<int>_>::
            BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
            ::ub((BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *)0x123020);
  local_7a0 = this_01;
  testing::internal::EqHelper<false>::Compare<int,double>
            ((char *)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
             (char *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),
             (int *)in_stack_fffffffffffff758,
             (double *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750));
  iVar2 = (int)((ulong)in_stack_fffffffffffff758 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_790);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffff77c);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    in_stack_fffffffffffff770 =
         (TestProblem *)testing::AssertionResult::failure_message((AssertionResult *)0x1230ed);
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,(char *)in_stack_fffffffffffff770,in_stack_fffffffffffff76c,
               (char *)CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_00.impl_,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750));
    testing::Message::~Message((Message *)0x12314a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1231a2);
  AVar4 = mp::SPAdapter::con((SPAdapter *)
                             CONCAT44(in_stack_fffffffffffff764,in_stack_fffffffffffff760),iVar2);
  iVar2 = AVar4.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_
  ;
  uVar5 = AVar4.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
          problem_._0_4_;
  line = AVar4.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
         problem_._4_4_;
  expected = (int *)mp::BasicProblem<mp::BasicProblemParams<int>_>::
                    BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                    ::ub((BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                          *)0x12320d);
  testing::internal::EqHelper<false>::Compare<int,double>
            ((char *)CONCAT44(line,uVar5),(char *)CONCAT44(iVar2,in_stack_fffffffffffff760),expected
             ,(double *)CONCAT44(in_stack_fffffffffffff754,in_stack_fffffffffffff750));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_7e0);
  uVar5 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff754);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::AssertionResult::failure_message((AssertionResult *)0x1232ba);
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,(char *)in_stack_fffffffffffff770,line,
               (char *)CONCAT44(iVar2,in_stack_fffffffffffff760));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_00.impl_,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(uVar5,in_stack_fffffffffffff750));
    testing::Message::~Message((Message *)0x123315);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12336a);
  mp::SPAdapter::~SPAdapter((SPAdapter *)CONCAT44(uVar5,in_stack_fffffffffffff750));
  TestProblem::~TestProblem((TestProblem *)CONCAT44(uVar5,in_stack_fffffffffffff750));
  return;
}

Assistant:

TEST(SPTest, OrderConsByStage) {
  auto header = MakeHeader(1);
  header.num_con_nonzeros = 1;
  TestProblem p(header);
  auto stage = p.AddIntSuffix("stage", mp::suf::VAR, 1);
  stage.SetValue(0, 2);
  p.AddCon(0, 7);
  p.AddCon(0, 11);
  p.OnColumnSizes().Add(1);
  auto expr = p.OnLinearConExpr(0);
  expr.AddTerm(0, 1);
  mp::SPAdapter sp(p);
  EXPECT_EQ(11, sp.con(0).ub());
  EXPECT_EQ( 7, sp.con(1).ub());
}